

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O3

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
::GroupByState(GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
               *this,IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
                     *in,function<bool_(const_int_&)> *transformer)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_IState<linq::IGrouping<bool,_int_&>_>)._vptr_IState =
       (_func_int **)&PTR_Init_00157bc8;
  (this->source).source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_001571a0;
  (this->source).source.s1 = (in->source).s1;
  (this->source).source.source1.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  (this->source).source.source1.state.
  super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (in->source).source1.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var2 = (in->source).source1.state.
           super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->source).source.source1.state.
  super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->source).source.source2.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  (this->source).source.source2.state.
  super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (in->source).source2.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var2 = (in->source).source2.state.
           super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->source).source.source2.state.
  super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  std::function<bool_(const_int_&)>::function(&this->transformer,transformer);
  p_Var1 = &(this->result)._M_t._M_impl.super__Rb_tree_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->current)._M_node = (_Base_ptr)0x0;
  return;
}

Assistant:

GroupByState(S&& in, const std::function<KEY(const VALUE&)>& transformer) 
				: source(in), transformer(transformer)
			{
			}